

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
 __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::parse_internal(parser *this,bool keep)

{
  lexer *plVar1;
  value_t vVar2;
  bool bVar3;
  token_type tVar4;
  undefined8 *puVar5;
  reference this_00;
  undefined8 uVar6;
  char in_DL;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value extraout_RDX_02;
  json_value extraout_RDX_03;
  json_value extraout_RDX_04;
  json_value extraout_RDX_05;
  json_value extraout_RDX_06;
  json_value extraout_RDX_07;
  json_value extraout_RDX_08;
  json_value extraout_RDX_09;
  json_value extraout_RDX_10;
  json_value extraout_RDX_11;
  json_value jVar7;
  json_value extraout_RDX_12;
  json_value extraout_RDX_13;
  json_value extraout_RDX_14;
  json_value extraout_RDX_15;
  byte bVar8;
  int iVar9;
  undefined7 in_register_00000031;
  parser *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_02;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  bVar10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  parse_event_t local_e1;
  parser *local_e0;
  undefined1 local_d8 [64];
  json_value local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_01 = (parser *)CONCAT71(in_register_00000031,keep);
  *(undefined1 *)&this->depth = 8;
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)this);
  tVar4 = this_01->last_token;
  switch(tVar4) {
  case literal_true:
    tVar4 = lexer::scan(&this_01->m_lexer);
    this_01->last_token = tVar4;
    *(undefined1 *)&this->depth = 4;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = 1;
    jVar7 = extraout_RDX_03;
    break;
  case literal_false:
    tVar4 = lexer::scan(&this_01->m_lexer);
    this_01->last_token = tVar4;
    *(undefined1 *)&this->depth = 4;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
    jVar7 = extraout_RDX_04;
    break;
  case literal_null:
    tVar4 = lexer::scan(&this_01->m_lexer);
    this_01->last_token = tVar4;
    *(undefined1 *)&this->depth = 0;
    jVar7 = extraout_RDX_00;
    break;
  case value_string:
    lexer::get_string((string_t *)(local_d8 + 0x10),&this_01->m_lexer);
    tVar4 = lexer::scan(&this_01->m_lexer);
    this_01->last_token = tVar4;
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_d8 + 0x10));
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_90);
    iVar9 = this->depth;
    *(char *)&this->depth = local_90._M_local_buf[0];
    uVar6 = *(undefined8 *)&(this->callback).super__Function_base._M_functor;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = local_90._8_8_;
    local_90._M_local_buf[0] = (char)iVar9;
    local_90._8_8_ = uVar6;
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this);
    ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&local_90);
    jVar7 = extraout_RDX_01;
    if ((undefined1 *)CONCAT44(local_d8._20_4_,local_d8._16_4_) != local_d8 + 0x20) {
      operator_delete((undefined1 *)CONCAT44(local_d8._20_4_,local_d8._16_4_));
      jVar7 = extraout_RDX_02;
    }
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    lexer::get_number(&this_01->m_lexer,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)this,tVar4);
    tVar4 = lexer::scan(&this_01->m_lexer);
    this_01->last_token = tVar4;
    jVar7 = extraout_RDX;
    break;
  case begin_array:
    if (in_DL == '\0') {
LAB_00115a3d:
      bVar8 = 0;
    }
    else {
      if ((this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_d8._16_4_ = this_01->depth;
        this_01->depth = local_d8._16_4_ + 1;
        local_d8[0] = array_start;
        bVar3 = (*(this_01->callback)._M_invoker)
                          ((_Any_data *)&this_01->callback,(int *)(local_d8 + 0x10),local_d8,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
        if (!bVar3) goto LAB_00115a3d;
      }
      *(undefined1 *)&this->depth = 2;
      puVar5 = (undefined8 *)operator_new(0x18);
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      *(undefined8 **)&(this->callback).super__Function_base._M_functor = puVar5;
      bVar8 = 1;
    }
    plVar1 = &this_01->m_lexer;
    tVar4 = lexer::scan(plVar1);
    this_01->last_token = tVar4;
    if (tVar4 == end_array) {
      tVar4 = lexer::scan(plVar1);
      this_01->last_token = tVar4;
      jVar7 = extraout_RDX_07;
      if ((this_01->callback).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_00115b5c;
      local_d8._16_4_ = this_01->depth + -1;
      this_01->depth = local_d8._16_4_;
      local_d8[0] = array_end;
      bVar3 = (*(this_01->callback)._M_invoker)
                        ((_Any_data *)&this_01->callback,(int *)(local_d8 + 0x10),local_d8,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)this);
      jVar7 = extraout_RDX_08;
      if (bVar3) goto LAB_00115b5c;
      this_02 = &local_60;
    }
    else {
      unexpect(this_01,value_separator);
      if (this_01->last_token != value_separator) goto LAB_00115b96;
      do {
        tVar4 = lexer::scan(plVar1);
        this_01->last_token = tVar4;
LAB_00115b96:
        parse_internal((parser *)(local_d8 + 0x10),keep);
        if ((bool)(local_d8[0x10] != '\b' & bVar8)) {
          push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)(local_d8 + 0x10));
        }
        ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_d8 + 0x10));
      } while (this_01->last_token == value_separator);
      expect(this_01,end_array);
      tVar4 = lexer::scan(plVar1);
      this_01->last_token = tVar4;
      jVar7 = extraout_RDX_12;
      if (!(bool)(bVar8 & (this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0)
         ) goto LAB_00115b5c;
      iVar9 = this_01->depth + -1;
      this_01->depth = iVar9;
      bVar3 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_01->callback,iVar9,array_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar7 = extraout_RDX_13;
      if (bVar3) goto LAB_00115b5c;
      this_02 = &local_70;
    }
    goto LAB_00115b71;
  case begin_object:
    if (in_DL == '\0') {
LAB_00115aa6:
      bVar8 = 0;
    }
    else {
      if ((this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_d8._16_4_ = this_01->depth;
        this_01->depth = local_d8._16_4_ + 1;
        local_d8[0] = object_start;
        bVar3 = (*(this_01->callback)._M_invoker)
                          ((_Any_data *)&this_01->callback,(int *)(local_d8 + 0x10),local_d8,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
        if (!bVar3) goto LAB_00115aa6;
      }
      *(undefined1 *)&this->depth = 1;
      puVar5 = (undefined8 *)operator_new(0x30);
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      puVar5[3] = puVar5 + 1;
      puVar5[4] = puVar5 + 1;
      puVar5[5] = 0;
      *(undefined8 **)&(this->callback).super__Function_base._M_functor = puVar5;
      bVar8 = 1;
    }
    plVar1 = &this_01->m_lexer;
    tVar4 = lexer::scan(plVar1);
    this_01->last_token = tVar4;
    if (tVar4 == end_object) {
      tVar4 = lexer::scan(plVar1);
      this_01->last_token = tVar4;
      jVar7 = extraout_RDX_09;
      if ((bVar8 & (this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_00115b5c;
      iVar9 = this_01->depth + -1;
      this_01->depth = iVar9;
      bVar3 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_01->callback,iVar9,object_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar7 = extraout_RDX_10;
      if (bVar3) goto LAB_00115b5c;
      this_02 = &local_40;
    }
    else {
      unexpect(this_01,value_separator);
      local_e0 = this;
      if (this_01->last_token != value_separator) goto LAB_00115c51;
      do {
        tVar4 = lexer::scan(plVar1);
        this_01->last_token = tVar4;
LAB_00115c51:
        expect(this_01,value_string);
        lexer::get_string((string_t *)(local_d8 + 0x10),plVar1);
        bVar3 = false;
        if ((bVar8 != 0) &&
           (bVar3 = true, (this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0)
           ) {
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x10));
          local_d8._52_4_ = this_01->depth;
          local_e1 = key;
          if ((this_01->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
            uVar6 = std::__throw_bad_function_call();
            ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)(local_d8 + 0x38));
            ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_d8);
            if ((undefined1 *)CONCAT44(local_d8._20_4_,local_d8._16_4_) != local_d8 + 0x20) {
              operator_delete((undefined1 *)CONCAT44(local_d8._20_4_,local_d8._16_4_));
            }
            ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_e0);
            _Unwind_Resume(uVar6);
          }
          bVar3 = (*(this_01->callback)._M_invoker)
                            ((_Any_data *)&this_01->callback,(int *)(local_d8 + 0x34),&local_e1,
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_d8);
          ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_d8);
        }
        tVar4 = lexer::scan(plVar1);
        this_01->last_token = tVar4;
        expect(this_01,name_separator);
        tVar4 = lexer::scan(plVar1);
        this_01->last_token = tVar4;
        parse_internal((parser *)local_d8,keep);
        if (((bVar3 & bVar8) == 1) && (local_d8[0] != 8)) {
          local_d8[0x38] = local_d8[0];
          local_98 = (json_value)local_d8._8_8_;
          assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_d8);
          local_d8[0] = object_start;
          local_d8._8_8_ = (object_t *)0x0;
          assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)(local_d8 + 0x38));
          this_00 = operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)this,(key_type *)(local_d8 + 0x10));
          assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)(local_d8 + 0x38));
          vVar2 = this_00->m_type;
          this_00->m_type = local_d8[0x38];
          jVar7 = this_00->m_value;
          this_00->m_value = local_98;
          local_d8[0x38] = vVar2;
          local_98 = jVar7;
          assert_invariant(this_00);
          ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(local_d8 + 0x38));
          this = local_e0;
        }
        ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_d8);
        if ((undefined1 *)CONCAT44(local_d8._20_4_,local_d8._16_4_) != local_d8 + 0x20) {
          operator_delete((undefined1 *)CONCAT44(local_d8._20_4_,local_d8._16_4_));
        }
      } while (this_01->last_token == value_separator);
      expect(this_01,end_object);
      tVar4 = lexer::scan(plVar1);
      this_01->last_token = tVar4;
      jVar7 = extraout_RDX_14;
      if ((bVar8 & (this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_00115b5c;
      iVar9 = this_01->depth + -1;
      this_01->depth = iVar9;
      bVar3 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_01->callback,iVar9,object_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar7 = extraout_RDX_15;
      if (bVar3) goto LAB_00115b5c;
      this_02 = &local_50;
    }
LAB_00115b71:
    this_02->_M_local_buf[0] = '\b';
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this_02);
    operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)this_02);
    goto LAB_00115b54;
  default:
    unexpect(this_01,tVar4);
    jVar7 = extraout_RDX_05;
  }
  if ((in_DL != '\0') && ((this_01->callback).super__Function_base._M_manager != (_Manager_type)0x0)
     ) {
    local_d8._16_4_ = this_01->depth;
    local_d8[0] = value;
    bVar3 = (*(this_01->callback)._M_invoker)
                      ((_Any_data *)&this_01->callback,(int *)(local_d8 + 0x10),local_d8,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this);
    jVar7 = extraout_RDX_06;
    if (!bVar3) {
      this_02 = &local_80;
      local_80._M_local_buf[0] = '\b';
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this_02);
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this_02);
      iVar9 = this->depth;
      *(char *)&this->depth = local_80._M_local_buf[0];
      uVar6 = *(undefined8 *)&(this->callback).super__Function_base._M_functor;
      *(undefined8 *)&(this->callback).super__Function_base._M_functor = local_80._8_8_;
      local_80._M_local_buf[0] = (char)iVar9;
      local_80._8_8_ = uVar6;
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this);
LAB_00115b54:
      ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)this_02);
      jVar7 = extraout_RDX_11;
    }
  }
LAB_00115b5c:
  bVar10.m_value.object = jVar7.object;
  bVar10._0_8_ = this;
  return bVar10;
}

Assistant:

basic_json parse_internal(bool keep)
        {
            auto result = basic_json(value_t::discarded);

            switch (last_token)
            {
                case lexer::token_type::begin_object:
                {
                    if (keep and (not callback
                                  or ((keep = callback(depth++, parse_event_t::object_start, result)) != 0)))
                    {
                        // explicitly set result to object to cope with {}
                        result.m_type = value_t::object;
                        result.m_value = value_t::object;
                    }

                    // read next token
                    get_token();

                    // closing } -> we are done
                    if (last_token == lexer::token_type::end_object)
                    {
                        get_token();
                        if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                        {
                            result = basic_json(value_t::discarded);
                        }
                        return result;
                    }

                    // no comma is expected here
                    unexpect(lexer::token_type::value_separator);

                    // otherwise: parse key-value pairs
                    do
                    {
                        // ugly, but could be fixed with loop reorganization
                        if (last_token == lexer::token_type::value_separator)
                        {
                            get_token();
                        }

                        // store key
                        expect(lexer::token_type::value_string);
                        const auto key = m_lexer.get_string();

                        bool keep_tag = false;
                        if (keep)
                        {
                            if (callback)
                            {
                                basic_json k(key);
                                keep_tag = callback(depth, parse_event_t::key, k);
                            }
                            else
                            {
                                keep_tag = true;
                            }
                        }

                        // parse separator (:)
                        get_token();
                        expect(lexer::token_type::name_separator);

                        // parse and add value
                        get_token();
                        auto value = parse_internal(keep);
                        if (keep and keep_tag and not value.is_discarded())
                        {
                            result[key] = std::move(value);
                        }
                    }
                    while (last_token == lexer::token_type::value_separator);

                    // closing }
                    expect(lexer::token_type::end_object);
                    get_token();
                    if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                    {
                        result = basic_json(value_t::discarded);
                    }

                    return result;
                }

                case lexer::token_type::begin_array:
                {
                    if (keep and (not callback
                                  or ((keep = callback(depth++, parse_event_t::array_start, result)) != 0)))
                    {
                        // explicitly set result to object to cope with []
                        result.m_type = value_t::array;
                        result.m_value = value_t::array;
                    }

                    // read next token
                    get_token();

                    // closing ] -> we are done
                    if (last_token == lexer::token_type::end_array)
                    {
                        get_token();
                        if (callback and not callback(--depth, parse_event_t::array_end, result))
                        {
                            result = basic_json(value_t::discarded);
                        }
                        return result;
                    }

                    // no comma is expected here
                    unexpect(lexer::token_type::value_separator);

                    // otherwise: parse values
                    do
                    {
                        // ugly, but could be fixed with loop reorganization
                        if (last_token == lexer::token_type::value_separator)
                        {
                            get_token();
                        }

                        // parse value
                        auto value = parse_internal(keep);
                        if (keep and not value.is_discarded())
                        {
                            result.push_back(std::move(value));
                        }
                    }
                    while (last_token == lexer::token_type::value_separator);

                    // closing ]
                    expect(lexer::token_type::end_array);
                    get_token();
                    if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
                    {
                        result = basic_json(value_t::discarded);
                    }

                    return result;
                }

                case lexer::token_type::literal_null:
                {
                    get_token();
                    result.m_type = value_t::null;
                    break;
                }

                case lexer::token_type::value_string:
                {
                    const auto s = m_lexer.get_string();
                    get_token();
                    result = basic_json(s);
                    break;
                }

                case lexer::token_type::literal_true:
                {
                    get_token();
                    result.m_type = value_t::boolean;
                    result.m_value = true;
                    break;
                }

                case lexer::token_type::literal_false:
                {
                    get_token();
                    result.m_type = value_t::boolean;
                    result.m_value = false;
                    break;
                }

                case lexer::token_type::value_unsigned:
                case lexer::token_type::value_integer:
                case lexer::token_type::value_float:
                {
                    m_lexer.get_number(result, last_token);
                    get_token();
                    break;
                }

                default:
                {
                    // the last token was unexpected
                    unexpect(last_token);
                }
            }

            if (keep and callback and not callback(depth, parse_event_t::value, result))
            {
                result = basic_json(value_t::discarded);
            }
            return result;
        }